

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O0

void __thiscall
cmCommandArgumentParserHelper::AllocateParserType
          (cmCommandArgumentParserHelper *this,ParserType *pt,char *str,int len)

{
  size_t sVar1;
  pointer pcVar2;
  unique_ptr<char[],_std::default_delete<char[]>_> local_30;
  __array out;
  int len_local;
  char *str_local;
  ParserType *pt_local;
  cmCommandArgumentParserHelper *this_local;
  
  pt->str = (char *)0x0;
  out._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl._4_4_ = len;
  if (len == 0) {
    sVar1 = strlen(str);
    out._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
    super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl._4_4_ = (int)sVar1;
  }
  if (out._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
      super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
      super__Head_base<0UL,_char_*,_false>._M_head_impl._4_4_ != 0) {
    std::make_unique<char[]>((size_t)&local_30);
    pcVar2 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(&local_30);
    memcpy(pcVar2,str,
           (long)out._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                 super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                 super__Head_base<0UL,_char_*,_false>._M_head_impl._4_4_);
    pcVar2 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(&local_30);
    pcVar2[out._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
           super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
           super__Head_base<0UL,_char_*,_false>._M_head_impl._4_4_] = '\0';
    pcVar2 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(&local_30);
    pt->str = pcVar2;
    std::
    vector<std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::allocator<std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>
    ::push_back(&this->Variables,&local_30);
    std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&local_30);
  }
  return;
}

Assistant:

void cmCommandArgumentParserHelper::AllocateParserType(
  cmCommandArgumentParserHelper::ParserType* pt, const char* str, int len)
{
  pt->str = nullptr;
  if (len == 0) {
    len = static_cast<int>(strlen(str));
  }
  if (len == 0) {
    return;
  }
  auto out = cm::make_unique<char[]>(len + 1);
  memcpy(out.get(), str, len);
  out.get()[len] = 0;
  pt->str = out.get();
  this->Variables.push_back(std::move(out));
}